

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall M2TSStreamInfo::M2TSStreamInfo(M2TSStreamInfo *this,M2TSStreamInfo *other)

{
  M2TSStreamInfo *other_local;
  M2TSStreamInfo *this_local;
  
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::vector(&this->m_index);
  this->streamPID = other->streamPID;
  this->stream_coding_type = other->stream_coding_type;
  this->video_format = other->video_format;
  this->frame_rate_index = other->frame_rate_index;
  this->number_of_offset_sequences = other->number_of_offset_sequences;
  this->width = other->width;
  this->height = other->height;
  this->HDR = other->HDR;
  this->aspect_ratio_index = other->aspect_ratio_index;
  this->audio_presentation_type = other->audio_presentation_type;
  this->sampling_frequency_index = other->sampling_frequency_index;
  this->character_code = other->character_code;
  *(undefined4 *)this->language_code = *(undefined4 *)other->language_code;
  this->isSecondary = (bool)(other->isSecondary & 1);
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::operator=(&this->m_index,&other->m_index);
  return;
}

Assistant:

M2TSStreamInfo::M2TSStreamInfo(const M2TSStreamInfo& other)
{
    streamPID = other.streamPID;
    stream_coding_type = other.stream_coding_type;
    video_format = other.video_format;
    frame_rate_index = other.frame_rate_index;
    number_of_offset_sequences = other.number_of_offset_sequences;
    width = other.width;
    height = other.height;
    HDR = other.HDR;
    aspect_ratio_index = other.aspect_ratio_index;
    audio_presentation_type = other.audio_presentation_type;
    sampling_frequency_index = other.sampling_frequency_index;
    character_code = other.character_code;
    memcpy(language_code, other.language_code, sizeof(language_code));
    isSecondary = other.isSecondary;
    m_index = other.m_index;
}